

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_state.cc
# Opt level: O2

void __thiscall StateVar::GenAccessFunction(StateVar *this,Output *out_h,Env *env)

{
  char *pcVar1;
  char *pcVar2;
  string local_48;
  
  Type::DataTypeConstRefStr_abi_cxx11_(&local_48,this->type_);
  pcVar1 = Env::RValue(env,this->id_);
  pcVar2 = Env::LValue(env,this->id_);
  Output::println(out_h,"%s %s const\t{ return %s; }",local_48._M_dataplus._M_p,pcVar1,pcVar2);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void StateVar::GenAccessFunction(Output* out_h, Env* env)
	{
	out_h->println("%s %s const	{ return %s; }", type_->DataTypeConstRefStr().c_str(),
	               env->RValue(id_), env->LValue(id_));
	}